

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

Acec_Box_t * Acec_CreateBox(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vTree)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Bit_t *vVisit_00;
  Vec_Bit_t *p_00;
  Vec_Bit_t *p_01;
  Acec_Box_t *pAVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *p_02;
  int local_11c;
  Acec_Box_t *pBox;
  int Rank;
  int Box;
  int k;
  int j;
  int i;
  Vec_Int_t *vMap;
  Vec_Int_t *vLevel;
  Vec_Bit_t *vIsRoot;
  Vec_Bit_t *vIsLeaf;
  Vec_Bit_t *vVisit;
  int MaxRank;
  Vec_Int_t *vTree_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  iVar1 = Acec_CreateBoxMaxRank(vTree);
  iVar2 = Vec_IntSize(vAdds);
  vVisit_00 = Vec_BitStart(iVar2 / 6);
  iVar2 = Gia_ManObjNum(p);
  p_00 = Vec_BitStart(iVar2);
  iVar2 = Gia_ManObjNum(p);
  p_01 = Vec_BitStart(iVar2);
  pAVar4 = (Acec_Box_t *)calloc(1,0x30);
  pAVar4->pGia = p;
  pVVar5 = Vec_WecStart(iVar1 + 1);
  pAVar4->vAdds = pVVar5;
  pVVar5 = Vec_WecStart(iVar1 + 1);
  pAVar4->vLeafLits = pVVar5;
  pVVar5 = Vec_WecStart(iVar1 + 2);
  pAVar4->vRootLits = pVVar5;
  for (k = 0; iVar1 = Vec_IntSize(vTree), k + 1 < iVar1; k = k + 2) {
    iVar1 = Vec_IntEntry(vTree,k);
    iVar2 = Vec_IntEntry(vTree,k + 1);
    iVar3 = Vec_IntEntry(vAdds,iVar1 * 6);
    Vec_BitWriteEntry(p_00,iVar3,1);
    iVar3 = Vec_IntEntry(vAdds,iVar1 * 6 + 1);
    Vec_BitWriteEntry(p_00,iVar3,1);
    iVar3 = Vec_IntEntry(vAdds,iVar1 * 6 + 2);
    Vec_BitWriteEntry(p_00,iVar3,1);
    iVar3 = Vec_IntEntry(vAdds,iVar1 * 6 + 3);
    Vec_BitWriteEntry(p_01,iVar3,1);
    iVar3 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
    Vec_BitWriteEntry(p_01,iVar3,1);
    Vec_WecPush(pAVar4->vAdds,iVar2,iVar1);
  }
  for (k = 0; iVar1 = Vec_WecSize(pAVar4->vAdds), k < iVar1; k = k + 1) {
    pVVar6 = Vec_WecEntry(pAVar4->vAdds,k);
    Vec_IntSort(pVVar6,0);
  }
  pVVar6 = Acec_TreeCarryMap(p,vAdds,pAVar4->vAdds);
  k = Vec_WecSize(pAVar4->vAdds);
  while (k = k + -1, -1 < k) {
    p_02 = Vec_WecEntry(pAVar4->vAdds,k);
    for (Rank = 0; iVar1 = Vec_IntSize(p_02), Rank < iVar1; Rank = Rank + 1) {
      iVar1 = Vec_IntEntry(p_02,Rank);
      iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
      iVar2 = Vec_BitEntry(p_00,iVar2);
      if (iVar2 == 0) {
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
        iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 2);
        Acec_TreePhases_rec(p,vAdds,pVVar6,iVar2,(uint)(iVar1 != 0),vVisit_00);
      }
    }
  }
  Acec_TreeVerifyPhases(p,vAdds,pAVar4->vAdds);
  Acec_TreeVerifyPhases2(p,vAdds,pAVar4->vAdds);
  Vec_BitFree(vVisit_00);
  Vec_IntFree(pVVar6);
  Vec_BitWriteEntry(p_01,0,1);
  for (k = 0; iVar1 = Vec_WecSize(pAVar4->vAdds), k < iVar1; k = k + 1) {
    pVVar6 = Vec_WecEntry(pAVar4->vAdds,k);
    for (Box = 0; iVar1 = Vec_IntSize(pVVar6), Box < iVar1; Box = Box + 1) {
      iVar1 = Vec_IntEntry(pVVar6,Box);
      for (Rank = 0; Rank < 3; Rank = Rank + 1) {
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + Rank);
        iVar2 = Vec_BitEntry(p_01,iVar2);
        if (iVar2 == 0) {
          pVVar5 = pAVar4->vLeafLits;
          iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + Rank);
          iVar3 = Acec_SignBit2(vAdds,iVar1,Rank);
          iVar2 = Abc_Var2Lit(iVar2,iVar3);
          Vec_WecPush(pVVar5,k,iVar2);
        }
      }
      for (Rank = 3; Rank < 5; Rank = Rank + 1) {
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + Rank);
        iVar2 = Vec_BitEntry(p_00,iVar2);
        if (iVar2 == 0) {
          pVVar5 = pAVar4->vRootLits;
          if (Rank == 4) {
            local_11c = k + 1;
          }
          else {
            local_11c = k;
          }
          iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + Rank);
          iVar3 = Acec_SignBit2(vAdds,iVar1,Rank);
          iVar2 = Abc_Var2Lit(iVar2,iVar3);
          Vec_WecPush(pVVar5,local_11c,iVar2);
        }
      }
      iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 2);
      if ((iVar2 == 0) && (iVar1 = Acec_SignBit2(vAdds,iVar1,2), iVar1 != 0)) {
        Vec_WecPush(pAVar4->vLeafLits,k,1);
      }
    }
  }
  Vec_BitFree(p_00);
  Vec_BitFree(p_01);
  for (k = 0; iVar1 = Vec_WecSize(pAVar4->vLeafLits), k < iVar1; k = k + 1) {
    pVVar6 = Vec_WecEntry(pAVar4->vLeafLits,k);
    Vec_IntSort(pVVar6,0);
  }
  for (k = 0; iVar1 = Vec_WecSize(pAVar4->vRootLits), k < iVar1; k = k + 1) {
    pVVar6 = Vec_WecEntry(pAVar4->vRootLits,k);
    Vec_IntSort(pVVar6,1);
  }
  return pAVar4;
}

Assistant:

Acec_Box_t * Acec_CreateBox( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vTree )
{
    int MaxRank = Acec_CreateBoxMaxRank(vTree);
    Vec_Bit_t * vVisit  = Vec_BitStart( Vec_IntSize(vAdds)/6 );
    Vec_Bit_t * vIsLeaf = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel, * vMap;
    int i, j, k, Box, Rank;//, Count = 0;

    Acec_Box_t * pBox = ABC_CALLOC( Acec_Box_t, 1 );
    pBox->pGia        = p;
    pBox->vAdds       = Vec_WecStart( MaxRank + 1 );
    pBox->vLeafLits   = Vec_WecStart( MaxRank + 1 );
    pBox->vRootLits   = Vec_WecStart( MaxRank + 2 );

    // collect boxes; mark inputs/outputs
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
//        if ( 37 == Box && 6 == Rank )
//        {
//            printf( "Skipping one adder...\n" );
//            continue;
//        }
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+0), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+1), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+2), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+3), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+4), 1 );
        Vec_WecPush( pBox->vAdds, Rank, Box );
    }
    // sort each level
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntSort( vLevel, 0 );

    // set phases starting from roots
    vMap = Acec_TreeCarryMap( p, vAdds, pBox->vAdds );
    Vec_WecForEachLevelReverse( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+4) ) )
            {
                //printf( "Pushing phase of output %d of box %d\n", Vec_IntEntry(vAdds, 6*Box+4), Box );
                Acec_TreePhases_rec( p, vAdds, vMap, Vec_IntEntry(vAdds, 6*Box+4), Vec_IntEntry(vAdds, 6*Box+2) != 0, vVisit );
            }
    Acec_TreeVerifyPhases( p, vAdds, pBox->vAdds );
    Acec_TreeVerifyPhases2( p, vAdds, pBox->vAdds );
    Vec_BitFree( vVisit );
    Vec_IntFree( vMap );

    // collect inputs/outputs
    Vec_BitWriteEntry( vIsRoot, 0, 1 );
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, j )
        {
            for ( k = 0; k < 3; k++ )
                if ( !Vec_BitEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+k) ) )
                    Vec_WecPush( pBox->vLeafLits, i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
            for ( k = 3; k < 5; k++ )
                if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+k) ) )
                {
                    //if ( Vec_IntEntry(vAdds, 6*Box+k) == 10942 )
                    //{
                    //    printf( "++++++++++++ Skipping special\n" );
                    //    continue;
                    //}
                    Vec_WecPush( pBox->vRootLits, k == 4 ? i + 1 : i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
                }
            if ( Vec_IntEntry(vAdds, 6*Box+2) == 0 && Acec_SignBit2(vAdds, Box, 2) )
                Vec_WecPush( pBox->vLeafLits, i, 1 );
        }
    Vec_BitFree( vIsLeaf );
    Vec_BitFree( vIsRoot );
    // sort each level
    Vec_WecForEachLevel( pBox->vLeafLits, vLevel, i )
        Vec_IntSort( vLevel, 0 );
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, i )
        Vec_IntSort( vLevel, 1 );
    //return pBox;
/*
    // push literals forward
    //Vec_WecPrint( pBox->vLeafLits, 0 );
    Vec_WecForEachLevel( pBox->vLeafLits, vLevel, i )
    {
        int This, Prev = Vec_IntEntry(vLevel, 0);
        Vec_IntForEachEntryStart( vLevel, This, j, 1 )
        {
            if ( Prev != This )
            {
                Prev = This;
                continue;
            }
            if ( i+1 >= Vec_WecSize(pBox->vLeafLits) )
                continue;
            Vec_IntPushOrder( Vec_WecEntry(pBox->vLeafLits, i+1), This );
            Vec_IntDrop( vLevel, j-- );
            Vec_IntDrop( vLevel, j-- );
            Prev = -1;
            Count++;
        }
    }
    printf( "Pushed forward %d input literals.\n", Count );
*/
    //Vec_WecPrint( pBox->vLeafLits, 0 );
    return pBox;
}